

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::insert
          (SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U> *this,int *key,VmConstant **value)

{
  uint uVar1;
  Node *pNVar2;
  Node *item;
  uint i;
  uint local_24;
  uint bucket;
  uint bucketMask;
  VmConstant **value_local;
  int *key_local;
  SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U> *this_local;
  
  _bucket = value;
  value_local = (VmConstant **)key;
  key_local = (int *)this;
  if (*key == 0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<int, VmConstant *, IntHasher, 8>::insert(const Key &, const Value &) [Key = int, Value = VmConstant *, Hasher = IntHasher, N = 8]"
                 );
  }
  if (this->bucketCount <= this->count + (this->count >> 2)) {
    rehash(this);
  }
  local_24 = this->bucketCount - 1;
  uVar1 = IntHasher::operator()((IntHasher *)((long)&item + 7),*(int *)value_local);
  item._0_4_ = 0;
  while( true ) {
    i = uVar1 & local_24;
    if (this->bucketCount <= (uint)item) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0x5b,
                    "void SmallDenseMap<int, VmConstant *, IntHasher, 8>::insert(const Key &, const Value &) [Key = int, Value = VmConstant *, Hasher = IntHasher, N = 8]"
                   );
    }
    pNVar2 = this->data + i;
    if (pNVar2->key == 0) break;
    if (pNVar2->key == *(int *)value_local) {
      pNVar2->value = *_bucket;
      return;
    }
    uVar1 = i + (uint)item + 1;
    item._0_4_ = (uint)item + 1;
  }
  pNVar2->key = *(int *)value_local;
  pNVar2->value = *_bucket;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}